

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha.c
# Opt level: O2

int prepare_symbol(internal_binding_t *binding)

{
  gotcha_binding_t *pgVar1;
  link_map *map;
  char *pcVar2;
  FILE *pFVar3;
  uint uVar4;
  uint uVar5;
  library_t *plVar6;
  long lVar7;
  char *pcVar8;
  code *pcVar9;
  void *symbol;
  
  pFVar3 = _stderr;
  pgVar1 = binding->user_binding;
  if (1 < debug_level) {
    uVar4 = gotcha_gettid();
    uVar5 = getpid();
    fprintf(pFVar3,"[%d/%d][%s:%u] - Looking up exported symbols for %s\n",(ulong)uVar4,(ulong)uVar5
            ,"gotcha.c",0x67,pgVar1->name);
  }
  pcVar9 = std::__throw_regex_error;
  while( true ) {
    pFVar3 = _stderr;
    map = *(link_map **)pcVar9;
    if (map == (link_map *)0x0) {
      if (0 < debug_level) {
        uVar4 = gotcha_gettid();
        uVar5 = getpid();
        fprintf(pFVar3,"[%d/%d][%s:%u] - Symbol %s was found in program\n",(ulong)uVar4,(ulong)uVar5
                ,"gotcha.c",0x75,pgVar1->name);
      }
      return -1;
    }
    plVar6 = get_library(map);
    pFVar3 = _stderr;
    if (plVar6 == (library_t *)0x0) {
      if (2 < debug_level) {
        uVar4 = gotcha_gettid();
        uVar5 = getpid();
        pcVar2 = map->l_name;
        pcVar8 = "[NULL]";
        if ((pcVar2 != (char *)0x0) && (pcVar8 = pcVar2, *pcVar2 == '\0')) {
          pcVar8 = "[EMPTY]";
        }
        fprintf(pFVar3,"[%d/%d][%s:%u] - Creating new library object for %s\n",(ulong)uVar4,
                (ulong)uVar5,"gotcha.c",0x6b,pcVar8);
      }
      add_library(map);
    }
    lVar7 = lookup_exported_symbol(pgVar1->name,map,&symbol);
    if ((int)lVar7 != -1) break;
    pcVar9 = (code *)&map->l_next;
  }
  setInternalBindingAddressPointer(pgVar1->function_handle,symbol);
  return 0;
}

Assistant:

int prepare_symbol(struct internal_binding_t *binding) {
  int result = 0;
  struct link_map *lib = NULL;
  struct gotcha_binding_t *user_binding = binding->user_binding;

  debug_printf(2, "Looking up exported symbols for %s\n", user_binding->name);
  for (lib = _r_debug.r_map; lib != 0; lib = lib->l_next) {
    struct library_t *int_library = get_library(lib);
    if (!int_library) {
      debug_printf(3, "Creating new library object for %s\n", LIB_NAME(lib));
      int_library = add_library(lib);
    }
    void *symbol;
    result = lookup_exported_symbol(user_binding->name, lib, &symbol);
    if (result != -1) {
      setInternalBindingAddressPointer(user_binding->function_handle, symbol);
      return 0;
    }
  }
  debug_printf(1, "Symbol %s was found in program\n", user_binding->name);
  return -1;
}